

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void rehash(hash_table *hash_table,size_t key_size,size_t value_size)

{
  uint uVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  uint32_t *puVar6;
  void *value;
  void *key;
  size_t index;
  uint32_t hash;
  size_t n;
  size_t i;
  uint32_t *new_hashes;
  void *new_values;
  void *new_keys;
  size_t new_cap;
  size_t value_size_local;
  size_t key_size_local;
  hash_table *hash_table_local;
  
  new_keys = (void *)next_prime(hash_table->cap);
  if (new_keys <= (void *)hash_table->cap) {
    new_keys = (void *)(hash_table->cap * 2 + -1);
  }
  pvVar4 = xmalloc(key_size * (long)new_keys);
  pvVar5 = xmalloc(value_size * (long)new_keys);
  puVar6 = (uint32_t *)xcalloc((size_t)new_keys,4);
  n = 0;
  uVar2 = hash_table->cap;
  for (; n < uVar2; n = n + 1) {
    uVar1 = hash_table->hashes[n];
    if ((uVar1 & 0x80000000) != 0) {
      for (key = (void *)mod_prime((ulong)uVar1,(size_t)new_keys);
          (puVar6[(long)key] & 0x80000000) != 0;
          key = (void *)increment_wrap((size_t)new_keys,(size_t)key)) {
      }
      pvVar3 = hash_table->values;
      memcpy((void *)((long)pvVar4 + key_size * (long)key),
             (void *)((long)hash_table->keys + key_size * n),key_size);
      memcpy((void *)((long)pvVar5 + value_size * (long)key),(void *)((long)pvVar3 + value_size * n)
             ,value_size);
      puVar6[(long)key] = uVar1;
    }
  }
  free(hash_table->keys);
  free(hash_table->hashes);
  free(hash_table->values);
  hash_table->keys = pvVar4;
  hash_table->values = pvVar5;
  hash_table->hashes = puVar6;
  hash_table->cap = (size_t)new_keys;
  return;
}

Assistant:

static void rehash(struct hash_table* hash_table, size_t key_size, size_t value_size) {
    size_t new_cap = next_prime(hash_table->cap);
    if (new_cap <= hash_table->cap)
        new_cap = hash_table->cap * 2 - 1;
    void* new_keys       = xmalloc(key_size * new_cap);
    void* new_values     = xmalloc(value_size * new_cap);
    uint32_t* new_hashes = xcalloc(new_cap, sizeof(uint32_t));
    for (size_t i = 0, n = hash_table->cap; i < n; ++i) {
        uint32_t hash = hash_table->hashes[i];
        if ((hash & ~HASH_MASK) == 0)
            continue;
        size_t index = mod_prime(hash, new_cap);
        while (new_hashes[index] & ~HASH_MASK)
            index = increment_wrap(new_cap, index);
        const void* key   = ((char*)hash_table->keys) + key_size * i;
        const void* value = ((char*)hash_table->values) + value_size * i;
        memcpy(((char*)new_keys) + key_size * index, key, key_size);
        memcpy(((char*)new_values) + value_size * index, value, value_size);
        new_hashes[index] = hash;
    }
    free(hash_table->keys);
    free(hash_table->hashes);
    free(hash_table->values);
    hash_table->keys   = new_keys;
    hash_table->values = new_values;
    hash_table->hashes = new_hashes;
    hash_table->cap    = new_cap;
}